

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O2

void __thiscall Costs::linReg(Costs *this,double *coeff,double *gtT,uint t,uint n)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = n + 1;
  dVar4 = 0.0;
  dVar5 = 0.0;
  for (uVar2 = (ulong)(t + 2); uVar2 < uVar1; uVar2 = uVar2 + 1) {
    dVar5 = dVar5 + gtT[uVar2];
    dVar4 = dVar4 + (double)(uVar2 & 0xffffffff) * gtT[uVar2];
  }
  uVar3 = n - t;
  dVar7 = (double)(uVar3 + 1) * (double)(uVar3 - 1) * (double)uVar3;
  dVar8 = ((double)(uVar1 + t) * -6.0) / dVar7;
  dVar6 = dVar8 * dVar5 + (12.0 / dVar7) * dVar4;
  dVar4 = (((double)(uVar1 + t) * 3.0) / dVar7 + 1.0 / (double)uVar3) * dVar5 + dVar8 * dVar4;
  dVar5 = 0.0;
  dVar7 = 0.0;
  for (uVar2 = (ulong)(t + 1); (uint)uVar2 < uVar1; uVar2 = uVar2 + 1) {
    dVar8 = gtT[uVar2] - ((double)(uVar2 & 0xffffffff) * dVar6 + dVar4);
    dVar5 = (double)(~-(ulong)(dVar8 < dVar5) & (ulong)dVar5 |
                    (ulong)dVar8 & -(ulong)(dVar8 < dVar5));
    dVar7 = (double)(~-(ulong)(dVar7 < dVar8) & (ulong)dVar7 |
                    (ulong)dVar8 & -(ulong)(dVar7 < dVar8));
  }
  *coeff = dVar6;
  coeff[1] = dVar6;
  coeff[2] = dVar4 + dVar5;
  coeff[3] = dVar4 + dVar7;
  return;
}

Assistant:

void Costs::linReg(double* coeff, double *gtT, unsigned int t, unsigned int n)
{
  double sum_gtT = 0;
  double sum_igtT = 0;
  for(unsigned int i = t + 2; i < n + 1; i++) // 0 in t + 1
  {
    sum_gtT = sum_gtT + gtT[i];
    sum_igtT = sum_igtT + i * gtT[i];
  }
  double prod3 = 1.0*(n-t)*(n-t-1)*(n-t+1);
  double sum3 = 1.0*(n+t+1);

  double slope = (-6*sum3/prod3)*sum_gtT + (12/prod3)*sum_igtT;
  double intercept =((1/(1.0*(n-t))) + 3*sum3/prod3)*sum_gtT - (6*sum3/prod3)*sum_igtT;

  double residuMax = 0;
  double residuMin = 0;

  for(unsigned int i = t + 1; i < n + 1; i++) // 0 in t + 1
  {
    if(gtT[i] - (slope*i + intercept) > residuMax){residuMax = gtT[i] - (slope*i + intercept);}
    if(gtT[i] - (slope*i + intercept) < residuMin){residuMin = gtT[i] - (slope*i + intercept);}
  }

  ///matrix of coefficients: Ap, Am, Gp, Gm
  coeff[0] = slope;
  coeff[1] = slope;
  coeff[2] = intercept + residuMin;
  coeff[3] = intercept + residuMax;
}